

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.cpp
# Opt level: O0

void __thiscall lsim::Simulator::release_node(Simulator *this,node_t node_id)

{
  size_type sVar1;
  node_t local_14;
  Simulator *pSStack_10;
  node_t node_id_local;
  Simulator *this_local;
  
  local_14 = node_id;
  pSStack_10 = this;
  sVar1 = std::vector<lsim::Value,_std::allocator<lsim::Value>_>::size(&this->m_node_values_read);
  if (node_id < sVar1) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (&this->m_free_nodes,&local_14);
    return;
  }
  __assert_fail("node_id < m_node_values_read.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/simulator.cpp"
                ,0xa7,"void lsim::Simulator::release_node(node_t)");
}

Assistant:

void Simulator::release_node(node_t node_id) {
    assert(node_id < m_node_values_read.size());
    m_free_nodes.push_back(node_id);
}